

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O0

v3i idx2::GetSpatialBrick(idx2_file *Idx2,int Level,u64 LinearBrick)

{
  byte bVar1;
  anon_union_12_8_3dedac88_for_v3<int>_1 aVar2;
  int iVar3;
  byte bVar4;
  uint auStack_440 [215];
  int J;
  int D;
  int I;
  v3i Brick3;
  int Size;
  u64 LinearBrick_local;
  int Level_local;
  idx2_file *Idx2_local;
  undefined8 local_28;
  
  bVar1 = (Idx2->BricksOrderStr).Buffer.Data[(long)Level * 0x81 + 0x80];
  Brick3.field_0.field_0.Y = (int)bVar1;
  D = 0;
  I = 0;
  Brick3.field_0.field_0.X = 0;
  J = 0;
  while( true ) {
    if (Brick3.field_0.field_0.Y <= J) {
      local_28._0_4_ = D >> 1;
      local_28._4_4_ = I >> 1;
      aVar2.field_0.Z = Brick3.field_0.field_0.X >> 1;
      aVar2.field_3.XY.field_0 = (v2<int>)(v2<int>)local_28;
      return (anon_union_12_8_3dedac88_for_v3<int>_1)
             (anon_union_12_8_3dedac88_for_v3<int>_1)aVar2.field_0;
    }
    unique0x100001d8 = LinearBrick;
    if (0x7f < J) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x237,"char &idx2::stack_string<128>::operator[](int) const [N = 128]");
    }
    iVar3 = (char)(Idx2->BricksOrderStr).Buffer.Data[(long)J + (long)Level * 0x81] + -0x58;
    bVar4 = (bVar1 - (char)J) - 1;
    if (2 < iVar3) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    (&D)[iVar3] = (&D)[iVar3] | (uint)((LinearBrick & 1L << (bVar4 & 0x3f)) >> (bVar4 & 0x3f));
    if (2 < iVar3) break;
    (&D)[iVar3] = (&D)[iVar3] << 1;
    J = J + 1;
  }
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

v3i
GetSpatialBrick(const idx2_file& Idx2, int Level, u64 LinearBrick)
{
  int Size = Idx2.BricksOrderStr[Level].Len;
  v3i Brick3(0);
  for (int I = 0; I < Size; ++I)
  {
    int D = Idx2.BricksOrderStr[Level][I] - 'X';
    int J = Size - I - 1;
    Brick3[D] |= (LinearBrick & (u64(1) << J)) >> J;
    Brick3[D] <<= 1;
  }
  return Brick3 >> 1;
}